

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_xonly_pubkey_serialize
              (secp256k1_context *ctx,uchar *output32,secp256k1_xonly_pubkey *pubkey)

{
  int iVar1;
  undefined1 local_80 [8];
  secp256k1_ge pk;
  secp256k1_xonly_pubkey *pubkey_local;
  uchar *output32_local;
  secp256k1_context *ctx_local;
  
  pk._80_8_ = pubkey;
  if (output32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"output32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    memset(output32,0,0x20);
    if (pk._80_8_ == 0) {
      secp256k1_callback_call(&ctx->illegal_callback,"pubkey != NULL");
      ctx_local._4_4_ = 0;
    }
    else {
      iVar1 = secp256k1_xonly_pubkey_load
                        (ctx,(secp256k1_ge *)local_80,(secp256k1_xonly_pubkey *)pk._80_8_);
      if (iVar1 == 0) {
        ctx_local._4_4_ = 0;
      }
      else {
        secp256k1_fe_get_b32(output32,(secp256k1_fe *)local_80);
        ctx_local._4_4_ = 1;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_xonly_pubkey_serialize(const secp256k1_context* ctx, unsigned char *output32, const secp256k1_xonly_pubkey *pubkey) {
    secp256k1_ge pk;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output32 != NULL);
    memset(output32, 0, 32);
    ARG_CHECK(pubkey != NULL);

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }
    secp256k1_fe_get_b32(output32, &pk.x);
    return 1;
}